

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void replaceFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  char cVar1;
  sqlite3 *psVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  char *__s2;
  void *__src;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  char *pOld;
  long local_78;
  
  psVar2 = context->pOut->db;
  pvVar8 = sqlite3ValueText(*argv,'\x01');
  if (pvVar8 != (void *)0x0) {
    uVar4 = sqlite3ValueBytes(*argv,'\x01');
    __s2 = (char *)sqlite3ValueText(argv[1],'\x01');
    if (__s2 != (char *)0x0) {
      if (*__s2 == '\0') {
        sqlite3VdbeMemCopy(context->pOut,*argv);
        return;
      }
      iVar5 = sqlite3ValueBytes(argv[1],'\x01');
      __src = sqlite3ValueText(argv[2],'\x01');
      if (__src != (void *)0x0) {
        iVar6 = sqlite3ValueBytes(argv[2],'\x01');
        local_78 = (long)(int)(uVar4 + 1);
        pcVar9 = (char *)contextMalloc(context,local_78);
        if (pcVar9 != (char *)0x0) {
          if ((int)(uVar4 - iVar5) < 0) {
            iVar13 = 0;
            iVar12 = 0;
          }
          else {
            uVar3 = 0;
            iVar12 = 0;
            iVar13 = 0;
            pOld = pcVar9;
            do {
              cVar1 = *(char *)((long)pvVar8 + (long)iVar13);
              pcVar9 = pOld;
              if ((cVar1 == *__s2) &&
                 (iVar7 = bcmp((void *)((long)iVar13 + (long)pvVar8),__s2,(long)iVar5), iVar7 == 0))
              {
                uVar11 = uVar3;
                if (iVar5 < iVar6) {
                  if ((long)psVar2->aLimit[0] < (iVar6 - iVar5) + local_78 + -1) {
                    context->isError = 0x12;
                    sqlite3VdbeMemSetStr
                              (context->pOut,"string or blob too big",-1,'\x01',
                               (_func_void_void_ptr *)0x0);
LAB_001bdf54:
                    sqlite3_free(pOld);
                    return;
                  }
                  local_78 = local_78 + (iVar6 - iVar5);
                  uVar11 = uVar3 + 1;
                  if ((uVar11 & uVar3) == 0) {
                    iVar7 = sqlite3_initialize();
                    if (iVar7 == 0) {
                      pcVar9 = (char *)sqlite3Realloc(pOld,(long)(int)local_78 +
                                                           (int)~uVar4 + local_78);
                    }
                    else {
                      pcVar9 = (char *)0x0;
                    }
                    if (pcVar9 == (char *)0x0) {
                      sqlite3_result_error_nomem(context);
                      goto LAB_001bdf54;
                    }
                  }
                }
                memcpy(pcVar9 + iVar12,__src,(long)iVar6);
                iVar12 = iVar12 + iVar6;
                iVar7 = iVar13 + iVar5 + -1;
                uVar3 = uVar11;
              }
              else {
                lVar10 = (long)iVar12;
                iVar12 = iVar12 + 1;
                pOld[lVar10] = cVar1;
                iVar7 = iVar13;
              }
              iVar13 = iVar7 + 1;
              pOld = pcVar9;
            } while (iVar7 < (int)(uVar4 - iVar5));
          }
          memcpy(pcVar9 + iVar12,(void *)((long)pvVar8 + (long)iVar13),(long)(int)(uVar4 - iVar13));
          iVar12 = (uVar4 - iVar13) + iVar12;
          pcVar9[iVar12] = '\0';
          setResultStrOrError(context,pcVar9,iVar12,'\x01',sqlite3_free);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void replaceFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zStr;        /* The input string A */
  const unsigned char *zPattern;    /* The pattern string B */
  const unsigned char *zRep;        /* The replacement string C */
  unsigned char *zOut;              /* The output */
  int nStr;                /* Size of zStr */
  int nPattern;            /* Size of zPattern */
  int nRep;                /* Size of zRep */
  i64 nOut;                /* Maximum size of zOut */
  int loopLimit;           /* Last zStr[] that might match zPattern[] */
  int i, j;                /* Loop counters */
  unsigned cntExpand;      /* Number zOut expansions */
  sqlite3 *db = sqlite3_context_db_handle(context);

  assert( argc==3 );
  UNUSED_PARAMETER(argc);
  zStr = sqlite3_value_text(argv[0]);
  if( zStr==0 ) return;
  nStr = sqlite3_value_bytes(argv[0]);
  assert( zStr==sqlite3_value_text(argv[0]) );  /* No encoding change */
  zPattern = sqlite3_value_text(argv[1]);
  if( zPattern==0 ){
    assert( sqlite3_value_type(argv[1])==SQLITE_NULL
            || sqlite3_context_db_handle(context)->mallocFailed );
    return;
  }
  if( zPattern[0]==0 ){
    assert( sqlite3_value_type(argv[1])!=SQLITE_NULL );
    sqlite3_result_value(context, argv[0]);
    return;
  }
  nPattern = sqlite3_value_bytes(argv[1]);
  assert( zPattern==sqlite3_value_text(argv[1]) );  /* No encoding change */
  zRep = sqlite3_value_text(argv[2]);
  if( zRep==0 ) return;
  nRep = sqlite3_value_bytes(argv[2]);
  assert( zRep==sqlite3_value_text(argv[2]) );
  nOut = nStr + 1;
  assert( nOut<SQLITE_MAX_LENGTH );
  zOut = contextMalloc(context, (i64)nOut);
  if( zOut==0 ){
    return;
  }
  loopLimit = nStr - nPattern;  
  cntExpand = 0;
  for(i=j=0; i<=loopLimit; i++){
    if( zStr[i]!=zPattern[0] || memcmp(&zStr[i], zPattern, nPattern) ){
      zOut[j++] = zStr[i];
    }else{
      if( nRep>nPattern ){
        nOut += nRep - nPattern;
        testcase( nOut-1==db->aLimit[SQLITE_LIMIT_LENGTH] );
        testcase( nOut-2==db->aLimit[SQLITE_LIMIT_LENGTH] );
        if( nOut-1>db->aLimit[SQLITE_LIMIT_LENGTH] ){
          sqlite3_result_error_toobig(context);
          sqlite3_free(zOut);
          return;
        }
        cntExpand++;
        if( (cntExpand&(cntExpand-1))==0 ){
          /* Grow the size of the output buffer only on substitutions
          ** whose index is a power of two: 1, 2, 4, 8, 16, 32, ... */
          u8 *zOld;
          zOld = zOut;
          zOut = sqlite3_realloc64(zOut, (int)nOut + (nOut - nStr - 1));
          if( zOut==0 ){
            sqlite3_result_error_nomem(context);
            sqlite3_free(zOld);
            return;
          }
        }
      }
      memcpy(&zOut[j], zRep, nRep);
      j += nRep;
      i += nPattern-1;
    }
  }
  assert( j+nStr-i+1<=nOut );
  memcpy(&zOut[j], &zStr[i], nStr-i);
  j += nStr - i;
  assert( j<=nOut );
  zOut[j] = 0;
  sqlite3_result_text(context, (char*)zOut, j, sqlite3_free);
}